

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  Iterator *pIVar1;
  long in_RSI;
  long lVar2;
  long in_FS_OFFSET;
  Iterator *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)0x0;
  lVar2 = -1;
  do {
    lVar2 = lVar2 + 1;
    if (*(int *)(in_RSI + 0x38) <= lVar2) break;
    IteratorWrapper::status((IteratorWrapper *)&local_40);
    pIVar1 = local_40;
    (this->super_Iterator)._vptr_Iterator = (_func_int **)local_40;
    local_40 = (Iterator *)0x0;
    Status::~Status((Status *)&local_40);
  } while (pIVar1 == (Iterator *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }